

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::entry_point_args_argument_buffer_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,bool append_comma)

{
  bool bVar1;
  CompilerMSL *pCVar2;
  char cVar3;
  char cVar4;
  SPIRVariable *var;
  SPIRType *pSVar5;
  SPIREntryPoint *pSVar6;
  iterator iVar7;
  SPIRType *type;
  long *plVar8;
  size_type sVar9;
  undefined8 *puVar10;
  uint uVar11;
  long *plVar12;
  ulong *puVar13;
  size_type *psVar14;
  undefined7 in_register_00000011;
  ulong uVar15;
  undefined8 uVar16;
  ulong uVar17;
  _Alloc_hider _Var18;
  Bitset claimed_bindings;
  undefined1 local_138 [16];
  long local_128;
  long lStack_120;
  string local_118;
  CompilerMSL *local_f8;
  uint local_ec;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  long local_c0;
  ulong local_b8 [2];
  undefined4 local_a4;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_80;
  _Hashtable<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_78;
  ulong local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_a4 = (undefined4)CONCAT71(in_register_00000011,append_comma);
  entry_point_arg_stage_in_abi_cxx11_(__return_storage_ptr__,this);
  local_70 = 0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_78 = &(this->resource_bindings)._M_h;
  local_80 = &(this->recursive_inputs)._M_h;
  uVar15 = 0;
  local_f8 = this;
  do {
    uVar11 = this->argument_buffer_ids[uVar15];
    if ((ulong)uVar11 != 0) {
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar11);
      var = Variant::get<spirv_cross::SPIRVariable>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + uVar11);
      pSVar5 = Compiler::get_variable_data_type((Compiler *)this,var);
      if (__return_storage_ptr__->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pSVar6 = Compiler::get_entry_point((Compiler *)local_f8);
      local_138._4_4_ = (uint)uVar15;
      local_138._0_4_ = pSVar6->model;
      local_138._8_4_ = 0xfffffffc;
      iVar7 = ::std::
              _Hashtable<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(local_78,(key_type *)local_138);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_ec = (uint)uVar15;
        if ((local_70 >> (uVar15 & 0x3f) & 1) != 0) {
          local_ec = local_f8->next_metal_resource_index_buffer;
        }
      }
      else {
        *(undefined1 *)
         ((long)iVar7.
                super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                ._M_cur + 0x34) = 1;
        local_ec = *(uint *)((long)iVar7.
                                   super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                                   ._M_cur + 0x28);
      }
      local_118._M_dataplus._M_p._0_4_ = local_ec;
      if (local_ec < 0x40) {
        local_70 = local_70 | 1L << ((byte)local_ec & 0x3f);
      }
      else {
        local_138._0_8_ = &local_68;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_138._0_8_,&local_118,local_138);
      }
      pCVar2 = local_f8;
      type = Variant::get<spirv_cross::SPIRType>
                       ((local_f8->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(var->super_IVariant).field_0xc);
      get_type_address_space_abi_cxx11_(&local_118,pCVar2,type,(var->super_IVariant).self.id,true);
      plVar8 = (long *)::std::__cxx11::string::append((char *)&local_118);
      plVar12 = plVar8 + 2;
      if ((long *)*plVar8 == plVar12) {
        local_128 = *plVar12;
        lStack_120 = plVar8[3];
        local_138._0_8_ = &local_128;
      }
      else {
        local_128 = *plVar12;
        local_138._0_8_ = (long *)*plVar8;
      }
      local_138._8_8_ = plVar8[1];
      *plVar8 = (long)plVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_138._0_8_);
      if ((long *)local_138._0_8_ != &local_128) {
        operator_delete((void *)local_138._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      local_138._0_4_ = (pSVar5->super_IVariant).self.id;
      sVar9 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(local_80,(key_type_conflict *)local_138);
      if (sVar9 == 0) {
        (*(local_f8->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  ((string *)local_a0,local_f8,pSVar5,0);
        puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)local_a0);
        pCVar2 = local_f8;
        local_e8 = &local_d8;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_d8 = *puVar13;
          lStack_d0 = puVar10[3];
        }
        else {
          local_d8 = *puVar13;
          local_e8 = (ulong *)*puVar10;
        }
        local_e0 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        to_restrict(local_f8,uVar11,true);
        puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_e8);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_118.field_2._M_allocated_capacity = *puVar13;
          local_118.field_2._8_8_ = puVar10[3];
        }
        else {
          local_118.field_2._M_allocated_capacity = *puVar13;
          local_118._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_118._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        (*(pCVar2->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_c8,pCVar2,(ulong)uVar11,1);
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          uVar16 = local_118.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_c0 + local_118._M_string_length) {
          uVar17 = 0xf;
          if (local_c8 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8) {
            uVar17 = local_b8[0];
          }
          if (uVar17 < local_c0 + local_118._M_string_length) goto LAB_001dfc8e;
          puVar10 = (undefined8 *)
                    ::std::__cxx11::string::replace
                              ((ulong)&local_c8,0,(char *)0x0,(ulong)local_118._M_dataplus._M_p);
        }
        else {
LAB_001dfc8e:
          puVar10 = (undefined8 *)
                    ::std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_c8);
        }
        local_138._0_8_ = &local_128;
        plVar8 = puVar10 + 2;
        if ((long *)*puVar10 == plVar8) {
          local_128 = *plVar8;
          lStack_120 = puVar10[3];
        }
        else {
          local_128 = *plVar8;
          local_138._0_8_ = (long *)*puVar10;
        }
        local_138._8_8_ = puVar10[1];
        *puVar10 = plVar8;
        puVar10[1] = 0;
        *(undefined1 *)plVar8 = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_138._0_8_);
        if ((long *)local_138._0_8_ != &local_128) {
          operator_delete((void *)local_138._0_8_);
        }
        if (local_c8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8) {
          operator_delete(local_c8);
        }
        _Var18._M_p = local_118._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_001dfb0d;
      }
      else {
        local_a0[0] = local_90;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"void* ","");
        pCVar2 = local_f8;
        to_restrict(local_f8,uVar11,true);
        plVar8 = (long *)::std::__cxx11::string::append((char *)local_a0);
        local_e8 = &local_d8;
        puVar13 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar13) {
          local_d8 = *puVar13;
          lStack_d0 = plVar8[3];
        }
        else {
          local_d8 = *puVar13;
          local_e8 = (ulong *)*plVar8;
        }
        local_e0 = plVar8[1];
        *plVar8 = (long)puVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        (*(pCVar2->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_c8,pCVar2,(ulong)uVar11,1);
        uVar17 = 0xf;
        if (local_e8 != &local_d8) {
          uVar17 = local_d8;
        }
        if (uVar17 < (ulong)(local_c0 + local_e0)) {
          uVar17 = 0xf;
          if (local_c8 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8) {
            uVar17 = local_b8[0];
          }
          if (uVar17 < (ulong)(local_c0 + local_e0)) goto LAB_001dfa05;
          puVar10 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
        }
        else {
LAB_001dfa05:
          puVar10 = (undefined8 *)
                    ::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8);
        }
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_118.field_2._M_allocated_capacity = *puVar13;
          local_118.field_2._8_8_ = puVar10[3];
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        }
        else {
          local_118.field_2._M_allocated_capacity = *puVar13;
          local_118._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_118._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar10 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
        local_138._0_8_ = &local_128;
        plVar8 = puVar10 + 2;
        if ((long *)*puVar10 == plVar8) {
          local_128 = *plVar8;
          lStack_120 = puVar10[3];
        }
        else {
          local_128 = *plVar8;
          local_138._0_8_ = (long *)*puVar10;
        }
        local_138._8_8_ = puVar10[1];
        *puVar10 = plVar8;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_138._0_8_);
        if ((long *)local_138._0_8_ != &local_128) {
          operator_delete((void *)local_138._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        _Var18._M_p = (pointer)local_c8;
        if (local_c8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8) {
LAB_001dfb0d:
          operator_delete(_Var18._M_p);
        }
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0]);
      }
      cVar4 = '\x01';
      if (9 < local_ec) {
        uVar11 = local_ec;
        cVar3 = '\x04';
        do {
          cVar4 = cVar3;
          if (uVar11 < 100) {
            cVar4 = cVar4 + -2;
            goto LAB_001dfcac;
          }
          if (uVar11 < 1000) {
            cVar4 = cVar4 + -1;
            goto LAB_001dfcac;
          }
          if (uVar11 < 10000) goto LAB_001dfcac;
          bVar1 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          cVar3 = cVar4 + '\x04';
        } while (bVar1);
        cVar4 = cVar4 + '\x01';
      }
LAB_001dfcac:
      local_e8 = &local_d8;
      ::std::__cxx11::string::_M_construct((ulong)&local_e8,cVar4);
      ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8,(uint)local_e0,local_ec);
      plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x3064ce);
      psVar14 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_118.field_2._M_allocated_capacity = *psVar14;
        local_118.field_2._8_8_ = plVar8[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar14;
        local_118._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_118._M_string_length = plVar8[1];
      *plVar8 = (long)psVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)::std::__cxx11::string::append((char *)&local_118);
      local_138._0_8_ = &local_128;
      plVar12 = plVar8 + 2;
      if ((long *)*plVar8 == plVar12) {
        local_128 = *plVar12;
        lStack_120 = plVar8[3];
      }
      else {
        local_128 = *plVar12;
        local_138._0_8_ = (long *)*plVar8;
      }
      local_138._8_8_ = plVar8[1];
      *plVar8 = (long)plVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_138._0_8_);
      if ((long *)local_138._0_8_ != &local_128) {
        operator_delete((void *)local_138._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      uVar11 = local_ec + 1;
      if (local_ec + 1 < local_f8->next_metal_resource_index_buffer) {
        uVar11 = local_f8->next_metal_resource_index_buffer;
      }
      local_f8->next_metal_resource_index_buffer = uVar11;
      this = local_f8;
    }
    uVar15 = uVar15 + 1;
    if (uVar15 == 8) {
      entry_point_args_discrete_descriptors(this,__return_storage_ptr__);
      entry_point_args_builtin(this,__return_storage_ptr__);
      if ((char)local_a4 == '\x01' && __return_storage_ptr__->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_68);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

string CompilerMSL::entry_point_args_argument_buffer(bool append_comma)
{
	string ep_args = entry_point_arg_stage_in();
	Bitset claimed_bindings;

	for (uint32_t i = 0; i < kMaxArgumentBuffers; i++)
	{
		uint32_t id = argument_buffer_ids[i];
		if (id == 0)
			continue;

		add_resource_name(id);
		auto &var = get<SPIRVariable>(id);
		auto &type = get_variable_data_type(var);

		if (!ep_args.empty())
			ep_args += ", ";

		// Check if the argument buffer binding itself has been remapped.
		uint32_t buffer_binding;
		auto itr = resource_bindings.find({ get_entry_point().model, i, kArgumentBufferBinding });
		if (itr != end(resource_bindings))
		{
			buffer_binding = itr->second.first.msl_buffer;
			itr->second.second = true;
		}
		else
		{
			// As a fallback, directly map desc set <-> binding.
			// If that was taken, take the next buffer binding.
			if (claimed_bindings.get(i))
				buffer_binding = next_metal_resource_index_buffer;
			else
				buffer_binding = i;
		}

		claimed_bindings.set(buffer_binding);

		ep_args += get_argument_address_space(var) + " ";

		if (recursive_inputs.count(type.self))
			ep_args += string("void* ") + to_restrict(id, true) + to_name(id) + "_vp";
		else
			ep_args += type_to_glsl(type) + "& " + to_restrict(id, true) + to_name(id);

		ep_args += " [[buffer(" + convert_to_string(buffer_binding) + ")]]";

		next_metal_resource_index_buffer = max(next_metal_resource_index_buffer, buffer_binding + 1);
	}

	entry_point_args_discrete_descriptors(ep_args);
	entry_point_args_builtin(ep_args);

	if (!ep_args.empty() && append_comma)
		ep_args += ", ";

	return ep_args;
}